

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::TextFlow::Column::const_iterator::addIndentAndSuffix_abi_cxx11_
          (const_iterator *this,const_iterator start,const_iterator end)

{
  const_iterator end_00;
  const_iterator begin;
  string *in_RCX;
  const_iterator in_RDX;
  long in_RSI;
  string *in_RDI;
  AnsiSkippingString *in_R8;
  string *in_R9;
  size_t desired_indent;
  string *ret;
  const_iterator *in_stack_ffffffffffffff80;
  string local_70 [48];
  size_t local_40;
  undefined1 local_31;
  const_iterator cVar1;
  
  local_31 = 0;
  cVar1._M_current = (char *)in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  local_40 = indentSize(in_stack_ffffffffffffff80);
  std::__cxx11::string::append((ulong)in_RDI,(char)local_40);
  begin.m_it._M_current = cVar1._M_current;
  begin.m_string = in_RCX;
  end_00.m_it._M_current = in_RDX._M_current;
  end_00.m_string = in_R9;
  AnsiSkippingString::substring_abi_cxx11_(in_R8,begin,end_00);
  std::__cxx11::string::operator+=((string *)in_RDI,local_70);
  std::__cxx11::string::~string(local_70);
  if ((*(byte *)(in_RSI + 0x38) & 1) != 0) {
    std::__cxx11::string::push_back((char)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string Column::const_iterator::addIndentAndSuffix(
            AnsiSkippingString::const_iterator start,
            AnsiSkippingString::const_iterator end ) const {
            std::string ret;
            const auto desired_indent = indentSize();
            // ret.reserve( desired_indent + (end - start) + m_addHyphen );
            ret.append( desired_indent, ' ' );
            // ret.append( start, end );
            ret += m_column.m_string.substring( start, end );
            if ( m_addHyphen ) { ret.push_back( '-' ); }

            return ret;
        }